

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O1

void RC2_cbc_encrypt(uchar *in,uchar *out,long length,RC2_KEY *ks,uchar *iv,int enc)

{
  bool bVar1;
  uchar *puVar2;
  RC2_KEY *pRVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint32_t tin [2];
  uint local_50;
  uint local_4c;
  uchar *local_48;
  long local_40;
  RC2_KEY *local_38;
  
  uVar5 = *(uint *)iv;
  uVar4 = *(uint *)(iv + 4);
  if (enc == 0) {
    lVar7 = length;
    uVar6 = uVar5;
    uVar8 = uVar4;
    puVar2 = iv;
    pRVar3 = ks;
    if (7 < length) {
      do {
        local_38 = pRVar3;
        local_48 = puVar2;
        lVar7 = length + -8;
        uVar5 = *(uint *)in;
        uVar4 = *(uint *)((long)in + 4);
        in = (uchar *)((long)in + 8);
        local_50 = uVar5;
        local_4c = uVar4;
        local_40 = length;
        RC2_decrypt((ulong *)&local_50,local_38);
        uVar6 = uVar6 ^ local_50;
        uVar8 = uVar8 ^ local_4c;
        *out = (uchar)uVar6;
        out[1] = (uchar)(uVar6 >> 8);
        out[2] = (uchar)(uVar6 >> 0x10);
        out[3] = (uchar)(uVar6 >> 0x18);
        out[4] = (uchar)uVar8;
        out[5] = (uchar)(uVar8 >> 8);
        out[6] = (uchar)(uVar8 >> 0x10);
        out[7] = (uchar)(uVar8 >> 0x18);
        out = out + 8;
        iv = local_48;
        length = lVar7;
        ks = local_38;
        uVar6 = uVar5;
        uVar8 = uVar4;
        puVar2 = local_48;
        pRVar3 = local_38;
      } while (0xf < local_40);
    }
    if (lVar7 != 0) {
      local_50 = *(uint *)in;
      local_40 = CONCAT44(local_40._4_4_,local_50);
      local_4c = *(uint *)((long)in + 4);
      RC2_decrypt((ulong *)&local_50,ks);
      (*(code *)(&DAT_0028a67c + *(int *)(&DAT_0028a67c + (lVar7 + -1) * 4)))();
      return;
    }
  }
  else {
    if (7 < length) {
      lVar7 = length;
      local_50 = uVar5;
      local_4c = uVar4;
      local_48 = iv;
      do {
        local_50 = local_50 ^ *(uint *)in;
        local_4c = local_4c ^ *(uint *)((long)in + 4);
        length = lVar7 + -8;
        in = (uchar *)((long)in + 8);
        RC2_encrypt((ulong *)&local_50,ks);
        *(uint *)out = local_50;
        *(uint *)((long)out + 4) = local_4c;
        out = (uchar *)((long)out + 8);
        bVar1 = 0xf < lVar7;
        iv = local_48;
        lVar7 = length;
        uVar5 = local_50;
        uVar4 = local_4c;
      } while (bVar1);
    }
    if (length != 0) {
      (*(code *)(&DAT_0028a660 + *(int *)(&DAT_0028a660 + (length + -1) * 4)))
                (uVar4,uVar5,&DAT_0028a660 + *(int *)(&DAT_0028a660 + (length + -1) * 4));
      return;
    }
  }
  *iv = (uchar)uVar5;
  iv[1] = (uchar)(uVar5 >> 8);
  iv[2] = (uchar)(uVar5 >> 0x10);
  iv[3] = (uchar)(uVar5 >> 0x18);
  iv[4] = (uchar)uVar4;
  iv[5] = (uchar)(uVar4 >> 8);
  iv[6] = (uchar)(uVar4 >> 0x10);
  iv[7] = (uchar)(uVar4 >> 0x18);
  return;
}

Assistant:

static void RC2_cbc_encrypt(const uint8_t *in, uint8_t *out, size_t length,
                            RC2_KEY *ks, uint8_t *iv, int encrypt) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  long l = length;
  uint32_t tin[2];

  if (encrypt) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (l != -8) {
      c2ln(in, tin0, tin1, l + 8);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (l != -8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, l + 8);
      xor0 = tin0;
      xor1 = tin1;
    }
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}